

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_parser.cpp
# Opt level: O0

string * __thiscall duckdb::SQLLogicParser::ExtractStatement_abi_cxx11_(SQLLogicParser *this)

{
  ulong uVar1;
  bool bVar2;
  bool bVar3;
  size_type sVar4;
  long in_RSI;
  string *in_RDI;
  bool first_line;
  string *statement;
  reference in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  byte local_41;
  string *line;
  
  line = in_RDI;
  std::__cxx11::string::string((string *)in_RDI);
  bVar2 = true;
  while( true ) {
    uVar1 = *(ulong *)(in_RSI + 0x38);
    sVar4 = Catch::clara::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(in_RSI + 0x20));
    local_41 = 0;
    if (uVar1 < sVar4) {
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                   (size_type)in_stack_ffffffffffffff88);
      bVar3 = EmptyOrComment(line);
      local_41 = bVar3 ^ 0xff;
    }
    if ((local_41 & 1) == 0) break;
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
    operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (size_type)in_stack_ffffffffffffff88);
    in_stack_ffffffffffffff97 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                         (char *)in_stack_ffffffffffffff88);
    if ((bool)in_stack_ffffffffffffff97) {
      return in_RDI;
    }
    if (!bVar2) {
      std::__cxx11::string::operator+=((string *)in_RDI,anon_var_dwarf_6600e4 + 8);
    }
    in_stack_ffffffffffffff88 =
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                      (size_type)in_stack_ffffffffffffff88);
    std::__cxx11::string::operator+=((string *)in_RDI,(string *)in_stack_ffffffffffffff88);
    bVar2 = false;
    *(long *)(in_RSI + 0x38) = *(long *)(in_RSI + 0x38) + 1;
  }
  return in_RDI;
}

Assistant:

string SQLLogicParser::ExtractStatement() {
	string statement;

	bool first_line = true;
	while (current_line < lines.size() && !EmptyOrComment(lines[current_line])) {
		if (lines[current_line] == "----") {
			break;
		}
		if (!first_line) {
			statement += "\n";
		}
		statement += lines[current_line];
		first_line = false;

		current_line++;
	}

	return statement;
}